

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O1

APInt * __thiscall llvm::APInt::operator=(APInt *this,uint64_t RHS)

{
  uint uVar1;
  
  uVar1 = this->BitWidth;
  if ((ulong)uVar1 < 0x41) {
    (this->U).VAL = RHS;
    clearUnusedBits(this);
  }
  else {
    *(this->U).pVal = RHS;
    memset((void *)((this->U).VAL + 8),0,(ulong)((int)((ulong)uVar1 + 0x3f >> 3) - 8U & 0xfffffff8))
    ;
  }
  return this;
}

Assistant:

APInt &operator=(uint64_t RHS) {
    if (isSingleWord()) {
      U.VAL = RHS;
      clearUnusedBits();
    } else {
      U.pVal[0] = RHS;
      memset(U.pVal+1, 0, (getNumWords() - 1) * APINT_WORD_SIZE);
    }
    return *this;
  }